

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_substr
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  vm_val_t *in_RCX;
  CVmObjStringBuffer *in_RDX;
  CVmObjStringBuffer *in_RDI;
  int32_t len;
  int32_t idx;
  uint argc;
  undefined4 in_stack_ffffffffffffffa8;
  vm_datatype_t vVar3;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int32_t in_stack_ffffffffffffffd0;
  vm_datatype_t idx_00;
  
  if (in_RCX == (vm_val_t *)0x0) {
    vVar3 = 0;
  }
  else {
    vVar3 = in_RCX->typ;
  }
  idx_00 = vVar3;
  if ((getp_substr(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_substr(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_substr::desc,1,2);
    __cxa_guard_release(&getp_substr(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint *)in_RDI,(CVmNativeCodeDesc *)CONCAT44(vVar3,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_long_val();
    if (iVar2 < 0) {
      get_ext(in_RDI);
    }
    get_ext(in_RDI);
    if (VM_NIL < idx_00) {
      CVmBif::pop_long_val();
    }
    substr_to_string(in_RDX,in_RCX,idx_00,in_stack_ffffffffffffffd0);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_substr(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* remember the argument count */
    uint argc = (oargc != 0 ? *oargc : 0);
    
    /* check arguments */
    static CVmNativeCodeDesc desc(1, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index, and adjust for 0-based or end-based */
    int32_t idx = CVmBif::pop_long_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* if there's a length, pop it; otherwise use the rest of the string */
    int32_t len = get_ext()->len;
    if (argc >= 2)
        len = CVmBif::pop_long_val(vmg0_);

    /* retrieve the substring */
    substr_to_string(vmg_ retval, idx, len);

    /* handled */
    return TRUE;
}